

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O1

void remove_stone_from_lookup(event_path_data evp,int stone_num)

{
  int iVar1;
  long lVar2;
  
  iVar1 = -1;
  if (0 < (long)evp->stone_lookup_table_size) {
    lVar2 = 0;
    do {
      if (evp->stone_lookup_table[lVar2].global_id == stone_num) {
        iVar1 = (int)lVar2;
        break;
      }
      lVar2 = lVar2 + 1;
    } while (evp->stone_lookup_table_size != lVar2);
  }
  if ((iVar1 != -1) && (iVar1 < evp->stone_lookup_table_size + -1)) {
    lVar2 = (long)iVar1;
    do {
      evp->stone_lookup_table[lVar2] = evp->stone_lookup_table[lVar2 + 1];
      lVar2 = lVar2 + 1;
    } while (lVar2 < (long)evp->stone_lookup_table_size + -1);
  }
  return;
}

Assistant:

extern void
remove_stone_from_lookup(event_path_data evp, int stone_num)
{
    int i, stone = -1;
    for (i=0; i < evp->stone_lookup_table_size; i++) {
	if (evp->stone_lookup_table[i].global_id == stone_num) {
	    stone = i;
	    break;
	}
    }
    if (stone == -1) return;
    for (i=stone; i < evp->stone_lookup_table_size-1; i++) {
	evp->stone_lookup_table[i] = evp->stone_lookup_table[i+1];
    }
}